

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Object * __thiscall ICM::Interpreter::run(Interpreter *this)

{
  Element *this_00;
  undefined1 uVar1;
  Instruction IVar2;
  pointer ppIVar3;
  long *plVar4;
  long *plVar5;
  element_type *ppOVar6;
  int iVar7;
  time_t tVar8;
  InstructionData *pIVar9;
  Object *pOVar10;
  undefined4 extraout_var;
  string *first;
  size_t sVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint *puVar12;
  element_type *extraout_RDX;
  element_type *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  long lVar13;
  InstructionData *in_RSI;
  __fn *__fn;
  void *in_R8;
  long lVar14;
  long lVar15;
  InstructionData *pIVar16;
  Jump *inst;
  lightlist_creater<ICM::Object_*> llc;
  DataList v;
  InstructionData local_48;
  
  lVar14 = 0;
  tVar8 = time((time_t *)0x0);
  srand((uint)tVar8);
LAB_00136b49:
  ppIVar3 = (this->InstList->
            super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ).
            super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar16 = ppIVar3[lVar14];
  IVar2 = pIVar16->Inst;
  puVar12 = &switchD_00136b72::switchdataD_0014cbe0;
  iVar7 = 0x14cbe0;
  switch(IVar2) {
  case end:
    goto switchD_00136b72_caseD_1;
  case sing:
    pOVar10 = this->Result;
    goto LAB_00136df2;
  case stor:
    in_RSI = pIVar16 + 1;
    pOVar10 = getObject(this,(Element *)in_RSI);
    goto LAB_00136df2;
  case list:
    createDataList(&v,this,(vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>
                            *)(pIVar16 + 1));
    __fn = (__fn *)v._capacity;
    Common::lightlist_creater<ICM::Object_*>::lightlist_creater(&llc,v._capacity);
    ppOVar6 = v._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar13 = v._capacity << 3;
    __child_stack = extraout_RDX;
    for (lVar15 = 0; lVar13 != lVar15; lVar15 = lVar15 + 8) {
      iVar7 = Object::clone(*(Object **)((long)ppOVar6 + lVar15),__fn,__child_stack,(int)puVar12,
                            in_R8);
      __fn = (__fn *)(llc._count + 1);
      llc._data._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      [llc._count] = (element_type)CONCAT44(extraout_var,iVar7);
      puVar12 = (uint *)llc._count;
      __child_stack =
           llc._data._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      llc._count = (size_t)__fn;
    }
    pOVar10 = (Object *)operator_new(0x10);
    TypeBase::ListType::ListType((ListType *)&local_48,&llc._data);
    in_RSI = &local_48;
    Objects::DataObject<(ICM::DefaultType)17>::DataObject
              ((DataObject<(ICM::DefaultType)17> *)pOVar10,(T *)&local_48);
    (this->TempResult).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar14] = pOVar10;
    std::_Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>::~_Vector_base
              ((_Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)&local_48);
    this->Result = (this->TempResult).
                   super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&llc._data._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&v._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    break;
  case nop:
  case call:
  case iadd:
  case isub:
  case imul:
  case idiv:
  case imod:
  case ilrl:
  case farg:
  case fargl:
  case fargv:
  case fsub:
  case fsubr:
  case fsubv:
  case fcal:
  case set:
  case refs:
  case dec:
  case jmpc:
    break;
  case pti:
    pIVar9 = *(InstructionData **)((long)(pIVar16 + 1) + 8);
    for (pIVar16 = (InstructionData *)pIVar16[1]._vptr_InstructionData; pIVar16 != pIVar9;
        pIVar16 = pIVar16 + 1) {
      if ((*(char *)&pIVar16->_vptr_InstructionData == '\x03') &&
         (*(undefined1 *)((long)&pIVar16->_vptr_InstructionData + 1) == '\x04')) {
        first = getIdentName_abi_cxx11_((Element *)pIVar16);
        print<std::__cxx11::string,char[2]>(first,(char (*) [2])0x14d597);
      }
      in_RSI = pIVar16;
      pOVar10 = getObject(this,(Element *)pIVar16);
      if (pOVar10 == (Object *)0x0) {
        Common::Output::print("Null");
      }
      else {
        in_RSI = (InstructionData *)getObject(this,(Element *)pIVar16);
        Object::to_string_abi_cxx11_((string *)&llc,(Object *)in_RSI);
        Common::Output::print<std::__cxx11::string>((string *)&llc);
        std::__cxx11::string::~string((string *)&llc);
      }
      if ((*(char *)&pIVar16->_vptr_InstructionData == '\x03') &&
         (*(undefined1 *)((long)&pIVar16->_vptr_InstructionData + 1) == '\x04')) {
        Common::Output::print(")");
      }
      Common::Output::println();
    }
    break;
  case ccal:
    in_RSI = pIVar16 + 1;
    pOVar10 = CheckCall(this,(vector<ICM::Instruction::Element,_std::allocator<ICM::Instruction::Element>_>
                              *)in_RSI);
    goto LAB_00136df2;
  case let:
  case cpy:
  case ref:
    this_00 = (Element *)((long)(pIVar16 + 1) + 8);
    uVar1 = *(undefined1 *)((long)(pIVar16 + 1) + 8);
    if (uVar1 == sing) {
      sVar11 = Instruction::Element::getRefer(this_00);
      pIVar9 = (InstructionData *)
               (this->TempResult).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
               _M_impl.super__Vector_impl_data._M_start[sVar11];
    }
    else if (uVar1 == end) {
      pIVar9 = (InstructionData *)createObjectFromLiteral(this_00,this->EP);
    }
    else if ((uVar1 == stor) && (*(byte *)((long)(pIVar16 + 1) + 9) == 4)) {
      pIVar9 = (InstructionData *)getDyVarbData(this_00);
      if ((IVar2 != ref) && (IVar2 == cpy)) {
        iVar7 = Object::clone((Object *)pIVar9,(__fn *)in_RSI,__child_stack_01,iVar7,in_R8);
        pIVar9 = (InstructionData *)CONCAT44(extraout_var_01,iVar7);
      }
    }
    else {
      if (uVar1 != stor) {
        println<char[17]>((char (*) [17])"Error in Assign.");
        break;
      }
      pIVar9 = (InstructionData *)getIdentData(this_00);
    }
    in_RSI = pIVar9;
    setDyVarbData((IdentIndex *)&pIVar16->field_0xc,(Object *)in_RSI);
    break;
  case cpys:
    in_RSI = pIVar16 + 1;
    pOVar10 = getObject(this,(Element *)in_RSI);
    iVar7 = Object::clone(pOVar10,(__fn *)in_RSI,__child_stack_00,iVar7,in_R8);
    pOVar10 = (Object *)CONCAT44(extraout_var_00,iVar7);
LAB_00136df2:
    (this->TempResult).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar14] = pOVar10;
    this->Result = (this->TempResult).
                   super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14];
    break;
  case inc:
    pOVar10 = getDyVarbData((IdentIndex *)&pIVar16->field_0xc);
    *(long *)pOVar10->data = *pOVar10->data + 1;
    break;
  case jump:
    lVar14 = (long)pIVar16[1]._vptr_InstructionData;
    goto LAB_00136b49;
  case jmpf:
  case jmpn:
    in_RSI = pIVar16 + 1;
    pOVar10 = getObject(this,(Element *)in_RSI);
    if (pOVar10->type != 6) {
      println<char[18]>((char (*) [18])"Error Not Boolean");
      return (Object *)0x0;
    }
    if (((ppIVar3[lVar14]->Inst == jmpf & *pOVar10->data) != 0) ||
       (ppIVar3[lVar14]->Inst == jmpn && (*pOVar10->data & 1) == 0)) {
      lVar14 = (long)pIVar16[2]._vptr_InstructionData;
      goto LAB_00136b49;
    }
    break;
  case jpsm:
  case jpse:
  case jpla:
  case jple:
    pOVar10 = getDyVarbData((IdentIndex *)&pIVar16->field_0xc);
    plVar4 = (long *)pOVar10->data;
    in_RSI = (InstructionData *)((long)(pIVar16 + 1) + 8);
    pOVar10 = getObject(this,(Element *)in_RSI);
    if (3 < ppIVar3[lVar14]->Inst - jpsm) break;
    plVar5 = (long *)pOVar10->data;
    switch(ppIVar3[lVar14]->Inst) {
    case jpsm:
      if (*plVar5 <= *plVar4) break;
LAB_00136ed3:
      lVar14 = *(long *)((long)(pIVar16 + 2) + 8);
      goto LAB_00136b49;
    case jpse:
      if (*plVar4 <= *plVar5) goto LAB_00136ed3;
      break;
    case jpla:
      if (*plVar5 < *plVar4) goto LAB_00136ed3;
      break;
    case jple:
      if (*plVar5 <= *plVar4) goto LAB_00136ed3;
    }
    break;
  default:
    if (IVar2 == rest) {
      pOVar10 = getObject(this,(Element *)((long)(pIVar16 + 1) + 8));
      in_RSI = *pOVar10->data;
      setDyVarbRestType((IdentIndex *)&pIVar16->field_0xc,(TypeUnit)in_RSI);
    }
  }
  lVar14 = lVar14 + 1;
  goto LAB_00136b49;
switchD_00136b72_caseD_1:
  return this->Result;
}

Assistant:

Object* run() {
			size_t ProgramCounter = 0;
			std::srand(static_cast<unsigned>(std::time(0)));
			while (true) {
				using namespace Instruction;
				auto &Inst = InstList[ProgramCounter];
				//println(ProgramCounter, "| ", Inst->to_string());
				switch (Inst->inst()) {
				case ccal: {
					Insts::CheckCall &inst = static_cast<Insts::CheckCall&>(*Inst);
					TempResult[ProgramCounter] = CheckCall(inst.Data);
					Result = TempResult[ProgramCounter];
					break;
				}
						   /*case farg: {
						   Insts::FuncArgs &inst = static_cast<Insts::FuncArgs&>(*Inst);
						   Global.Func.Args = createDataList(inst.Args);
						   break;
						   }
						   case fargl: {
						   Insts::FuncArgsLight &inst = *static_cast<Insts::FuncArgsLight*>(Inst);
						   Global.Func.Args = inst.Args;
						   break;
						   }
						   case fargv: {
						   break;
						   }
						   case fsub: {
						   Insts::FuncSub &inst = static_cast<Insts::FuncSub&>(*Inst);
						   auto &args = Global.Func.Args;
						   auto &ftu = GlobalFunctionTable[inst.Func.index];
						   size_t id = getCallID(ftu, args);
						   if (id != ftu.size()) {
						   Global.Func.Func.index = inst.Func.index;
						   Global.Func.Func.subid = id;
						   }
						   else {
						   println("Error Unfind args match function ", ftu.getName(), ".");
						   Global.Func.Func.index = 0;
						   Global.Func.Func.subid = 0;
						   }
						   break;
						   }
						   case fsubr: {
						   break;
						   }
						   case fsubv: {
						   break;
						   }
						   case fcal: {
						   auto &args = Global.Func.Args;
						   auto &func = Global.Func.Func;
						   if (func.index == 0) {
						   println("Call Error");
						   return Result;
						   }
						   ObjectPtr &&op = GlobalFunctionTable[func.index][func.subid].call(args);
						   TempResult[ProgramCounter] = op.get();
						   Result = TempResult[ProgramCounter];
						   break;
						   }*/
				case let:
				case cpy:
				case ref: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					if (inst.Data.isLiteral()) {
						setDyVarbData(inst.VTU, createObjectFromLiteral(inst.Data, EP));
					}
					else if (inst.Data.isRefer()) {
						setDyVarbData(inst.VTU, TempResult[inst.Data.getRefer()]);
					}
					else if (inst.Data.isIdentType(I_DyVarb)) {
						switch (Inst->inst()) {
						case let:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data));
							break;
						case cpy:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data)->clone());
							break;
						case ref:
							setDyVarbData(inst.VTU, getDyVarbData(inst.Data)); // TODO
							break;
						}
					}
					else if (inst.Data.isIdent()) {
						setDyVarbData(inst.VTU, getIdentData(inst.Data));
					}
					else
						println("Error in Assign.");
					break;
				}
				case dim: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					break;
				}
				case rest: {
					Insts::Assign &inst = static_cast<Insts::Assign&>(*Inst);
					//(restrict a (type 5))
					Object *data = getObject(inst.Data);
					setDyVarbRestType(inst.VTU, data->dat<T_Type>().get());
					break;
				}
				case cpys: {
					Insts::CopySingle &inst = static_cast<Insts::CopySingle&>(*Inst);
					TempResult[ProgramCounter] = getObject(inst.Data)->clone(); // TODO
					Result = TempResult[ProgramCounter];
					break;
				}
				case stor: {
					Insts::Store &inst = static_cast<Insts::Store&>(*Inst);
					TempResult[ProgramCounter] = getObject(inst.Data); // TODO
					Result = TempResult[ProgramCounter];
					break;
				}
				case sing: {
					TempResult[ProgramCounter] = Result;
					Result = TempResult[ProgramCounter];
					break;
				}
				case jump: {
					Insts::Jump &inst = static_cast<Insts::Jump&>(*Inst);
					ProgramCounter = inst.Index;
					continue;
				}
				case jmpf:
				case jmpn: {
					Insts::JumpNot &inst = static_cast<Insts::JumpNot&>(*Inst);
					Object *op = getObject(inst.Data);
					if (op->isType(T_Boolean)) {
						bool r = op->dat<T_Boolean>();
						if ((Inst->inst() == jmpf && r) || (Inst->inst() == jmpn && !r)) {
							ProgramCounter = inst.Index;
							continue;
						}
					}
					else {
						println("Error Not Boolean");
						return nullptr;
					}
					break;
				}
				case inc: {
					Insts::Inc &inst = static_cast<Insts::Inc&>(*Inst);
					getDyVarbData(inst.VTU)->dat<T_Number>() += 1;
					break;
				}
				case jpsm:
				case jpse:
				case jpla:
				case jple: {
					Insts::JumpCompare &inst = static_cast<Insts::JumpCompare&>(*Inst);
					const auto &n1 = getDyVarbData(inst.VTU)->dat<T_Number>();
					const auto &n2 = getObject(inst.Data)->dat<T_Number>();
					bool r;
					switch (Inst->inst()) {
					case jpsm: r = n1 < n2; break;
					case jpse: r = n1 <= n2; break;
					case jpla: r = n1 > n2; break;
					case jple: r = n1 >= n2; break;
					default:   r = false;
					}
					if (r) {
						ProgramCounter = inst.Index;
						continue;
					}
					break;
				}
				case list: {
					Insts::List &inst = static_cast<Insts::List&>(*Inst);
					// TODO
					auto v = createDataList(inst.Data);
					lightlist_creater<Object*> llc(v.size());
					for (auto p : v) {
						llc.push_back(p->clone());
					}

					TempResult[ProgramCounter] = new Objects::List(TypeBase::ListType(llc.data()));
					Result = TempResult[ProgramCounter];
					break;
				}
				case pti: {
					Insts::PrintIdent &inst = static_cast<Insts::PrintIdent&>(*Inst);
					for (Element &e : inst.Args) {
						if (e.isIdentType(I_DyVarb))
							print(getIdentName(e), "(");
						Object *op = getObject(e);
						if (op)
							print(getObject(e)->to_string());
						else
							print("Null");
						if (e.isIdentType(I_DyVarb))
							print(")");
						println();
					}
					break;
				}
				case end: {
					return Result;
				}
				}
				ProgramCounter++;
			}
			return Result;
		}